

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTestExample.cpp
# Opt level: O0

void __thiscall AbstractTestExample::PrintDataInformation(AbstractTestExample *this)

{
  int iVar1;
  _Setw _Var2;
  _Setprecision _Var3;
  element_type *this_00;
  __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  element_type *this_02;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  double dVar7;
  double dVar8;
  double normalizedStd;
  double std;
  double meanImbalance;
  double percent;
  double tempL;
  int i;
  int steps;
  double sumsq;
  double sum;
  double imbalanceRatio;
  int negN;
  int posN;
  AbstractTestExample *this_local;
  
  imbalanceRatio._4_4_ = 0;
  imbalanceRatio._0_4_ = 0;
  sumsq = 0.0;
  _i = 0.0;
  tempL._4_4_ = 1;
  for (tempL._0_4_ = 0; tempL._0_4_ < this->trainN; tempL._0_4_ = tempL._0_4_ + 1) {
    this_00 = ::std::
              __shared_ptr_access<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->trainData);
    this_01 = (__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)::std::
                 vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
                 ::at(this_00,(long)tempL._0_4_);
    this_02 = ::std::
              __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_01);
    pvVar4 = ::std::vector<double,_std::allocator<double>_>::back(this_02);
    if ((*pvVar4 != 1.0) || (NAN(*pvVar4))) {
      imbalanceRatio._0_4_ = imbalanceRatio._0_4_ + 1;
    }
    else {
      imbalanceRatio._4_4_ = imbalanceRatio._4_4_ + 1;
    }
    pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->trainIndexEachUpdate,(long)tempL._4_4_);
    if (tempL._0_4_ == *pvVar5 + -1) {
      dVar7 = (double)imbalanceRatio._0_4_ / (double)imbalanceRatio._4_4_;
      sumsq = dVar7 + sumsq;
      _i = dVar7 * dVar7 + _i;
      tempL._4_4_ = tempL._4_4_ + 1;
      iVar1 = this->trainN;
      _Var2 = ::std::setw(4);
      poVar6 = ::std::operator<<((ostream *)&::std::cout,_Var2);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,::std::fixed);
      _Var3 = ::std::setprecision(2);
      poVar6 = ::std::operator<<(poVar6,_Var3);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,(double)tempL._0_4_ / (double)iVar1);
      poVar6 = ::std::operator<<(poVar6,"   ");
      _Var2 = ::std::setw(4);
      poVar6 = ::std::operator<<(poVar6,_Var2);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,::std::fixed);
      _Var3 = ::std::setprecision(2);
      poVar6 = ::std::operator<<(poVar6,_Var3);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dVar7);
      ::std::ostream::operator<<(poVar6,::std::endl<char,std::char_traits<char>>);
    }
  }
  dVar7 = sumsq / (double)(tempL._4_4_ + -1);
  dVar8 = sqrt(-dVar7 * dVar7 + _i / (double)(tempL._4_4_ + -1));
  poVar6 = ::std::operator<<((ostream *)&::std::cout,"meanImbalance ");
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dVar7);
  ::std::ostream::operator<<(poVar6,::std::endl<char,std::char_traits<char>>);
  poVar6 = ::std::operator<<((ostream *)&::std::cout,"std ");
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dVar8);
  ::std::ostream::operator<<(poVar6,::std::endl<char,std::char_traits<char>>);
  poVar6 = ::std::operator<<((ostream *)&::std::cout,"normalizedStd ");
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dVar8 / dVar7);
  ::std::ostream::operator<<(poVar6,::std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void AbstractTestExample::PrintDataInformation()
{
    // print imbalance ratio after one data chunk arrives
    int posN=0;
    int negN=0;
    double imbalanceRatio=0;
    double sum=0;
    double sumsq=0;
    int steps=1;
    for(int i=0; i<trainN;i++)
    {
        double tempL=trainData->at(i)->back();
        if(tempL==1.0)posN++;
        else negN++;
        
        if(i==trainIndexEachUpdate[steps]-1)
        {
            imbalanceRatio=static_cast<double>(negN)/posN;
            sum+=imbalanceRatio;
            sumsq+=imbalanceRatio*imbalanceRatio;
            steps++;
            double percent=static_cast<double>(i)/trainN;
            std::cout<<std::setw(4)<< std::fixed<< std::setprecision(2)<<percent<<"   "
                <<std::setw(4)<< std::fixed<< std::setprecision(2)<<imbalanceRatio<<std::endl;
        }
    }
    
    double meanImbalance=sum/(steps-1);
    double std=sqrt(sumsq/(steps-1)-meanImbalance*meanImbalance);
    double normalizedStd=std/meanImbalance;
    std::cout<<"meanImbalance "<<meanImbalance<< std::endl;
    std::cout<<"std "<<std<< std::endl;
    std::cout<<"normalizedStd "<<normalizedStd<< std::endl;
}